

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseRAPass::updateStackFrame(BaseRAPass *this)

{
  Error EVar1;
  Error EVar2;
  FuncFrame *in_RDI;
  Error _err_5;
  Error _err_4;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  Error _err;
  RegGroup group;
  Iterator __end2;
  Iterator __begin2;
  RegGroupVirtValues *__range2;
  FuncFrame *frame;
  RAStackAllocator *in_stack_00000068;
  FuncFrame *in_stack_00000490;
  FuncArgsAssignment *in_stack_00000498;
  RegMask in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff34;
  RegGroup group_00;
  RegGroup local_a2;
  undefined1 local_a1;
  undefined1 *local_a0;
  BaseRAPass *this_00;
  Error local_84;
  BaseRAPass *this_01;
  FuncFrame *in_stack_ffffffffffffffc0;
  
  this_01 = *(BaseRAPass **)(in_RDI[1]._dirtyRegs._data + 1);
  this_00 = (BaseRAPass *)&this_01->field_0x2d0;
  local_a0 = &local_a1;
  for (local_a2 = k0; local_a2 != kPC; local_a2 = local_a2 + kVec) {
    in_stack_ffffffffffffffc0 = (FuncFrame *)&local_a2;
    group_00 = local_a2;
    RARegMask::operator[]<asmjit::v1_14::RegGroup>
              ((RARegMask *)
               CONCAT17(local_a2,CONCAT16(local_a2,CONCAT24(in_stack_ffffffffffffff34,
                                                            in_stack_ffffffffffffff30))),
               (RegGroup *)this_00);
    FuncFrame::addDirtyRegs(in_RDI,group_00,in_stack_ffffffffffffff30);
  }
  FuncFrame::setLocalStackAlignment((FuncFrame *)this_00,in_RDI[5]._localStackSize);
  if (((in_RDI[10]._preservedRegs._data[2] == 0) ||
      (local_84 = _markStackArgsToKeep(this_01), local_84 == 0)) &&
     (EVar1 = RAStackAllocator::calculateStackFrame(in_stack_00000068), local_84 = EVar1, EVar1 == 0
     )) {
    *(uint32_t *)((long)&(this_00->super_FuncPass).super_Pass._name + 4) = in_RDI[5]._callStackSize;
    EVar2 = FuncArgsAssignment::updateFuncFrame(in_stack_00000498,in_stack_00000490);
    local_84 = EVar2;
    if ((((EVar2 == 0) && (local_84 = FuncFrame::finalize(in_stack_ffffffffffffffc0), local_84 == 0)
         ) && ((*(uint32_t *)&this_00->field_0x1c == 0 ||
               (local_84 = RAStackAllocator::adjustSlotOffsets
                                     ((RAStackAllocator *)CONCAT44(EVar1,EVar2),0), local_84 == 0)))
        ) && ((in_RDI[10]._preservedRegs._data[2] == 0 ||
              (local_84 = _updateStackArgs(this_00), local_84 == 0)))) {
      local_84 = 0;
    }
  }
  return local_84;
}

Assistant:

Error BaseRAPass::updateStackFrame() noexcept {
  // Update some StackFrame information that we updated during allocation. The only information we don't have at the
  // moment is final local stack size, which is calculated last.
  FuncFrame& frame = func()->frame();
  for (RegGroup group : RegGroupVirtValues{})
    frame.addDirtyRegs(group, _clobberedRegs[group]);
  frame.setLocalStackAlignment(_stackAllocator.alignment());

  // If there are stack arguments that are not assigned to registers upon entry and the function doesn't require
  // dynamic stack alignment we keep these arguments where they are. This will also mark all stack slots that match
  // these arguments as allocated.
  if (_numStackArgsToStackSlots)
    ASMJIT_PROPAGATE(_markStackArgsToKeep());

  // Calculate offsets of all stack slots and update StackSize to reflect the calculated local stack size.
  ASMJIT_PROPAGATE(_stackAllocator.calculateStackFrame());
  frame.setLocalStackSize(_stackAllocator.stackSize());

  // Update the stack frame based on `_argsAssignment` and finalize it. Finalization means to apply final calculation
  // to the stack layout.
  ASMJIT_PROPAGATE(_argsAssignment.updateFuncFrame(frame));
  ASMJIT_PROPAGATE(frame.finalize());

  // StackAllocator allocates all stots starting from [0], adjust them when necessary.
  if (frame.localStackOffset() != 0)
    ASMJIT_PROPAGATE(_stackAllocator.adjustSlotOffsets(int32_t(frame.localStackOffset())));

  // Again, if there are stack arguments allocated in function's stack we have to handle them. This handles all cases
  // (either regular or dynamic stack alignment).
  if (_numStackArgsToStackSlots)
    ASMJIT_PROPAGATE(_updateStackArgs());

  return kErrorOk;
}